

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

_Bool ExportImageAsCode(Image image,char *fileName)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char local_138 [264];
  
  uVar2 = GetPixelDataSize(image.width,image.height,image.format);
  pcVar6 = (char *)calloc((long)(int)(uVar2 * 6 + 2000),1);
  memcpy(pcVar6,
         "////////////////////////////////////////////////////////////////////////////////////////\n"
         ,0x5a);
  memcpy(pcVar6 + 0x59,
         "//                                                                                    //\n"
         ,0x5a);
  memcpy(pcVar6 + 0xb2,
         "// ImageAsCode exporter v1.0 - Image pixel data exported as an array of bytes         //\n"
         ,0x5a);
  memcpy(pcVar6 + 0x10b,
         "//                                                                                    //\n"
         ,0x5a);
  memcpy(pcVar6 + 0x164,
         "// more info and bugs-report:  github.com/raysan5/raylib                              //\n"
         ,0x5a);
  memcpy(pcVar6 + 0x1bd,
         "// feedback and support:       ray[at]raylib.com                                      //\n"
         ,0x5a);
  memcpy(pcVar6 + 0x216,
         "//                                                                                    //\n"
         ,0x5a);
  memcpy(pcVar6 + 0x26f,
         "// Copyright (c) 2018-2024 Ramon Santamaria (@raysan5)                                //\n"
         ,0x5a);
  memcpy(pcVar6 + 0x2c8,
         "//                                                                                    //\n"
         ,0x5a);
  memcpy(pcVar6 + 0x321,
         "////////////////////////////////////////////////////////////////////////////////////////\n\n"
         ,0x5b);
  memset(local_138,0,0x100);
  pcVar7 = GetFileNameWithoutExt(fileName);
  strcpy(local_138,pcVar7);
  if (local_138[0] != '\0') {
    pcVar7 = local_138;
    do {
      pcVar7 = pcVar7 + 1;
      if ((byte)(local_138[0] + 0x9fU) < 0x1a) {
        pcVar7[-1] = local_138[0] + -0x20;
      }
      local_138[0] = *pcVar7;
    } while (local_138[0] != '\0');
  }
  builtin_strncpy(pcVar6 + 0x37b,"// Image data information\n",0x1b);
  iVar3 = sprintf(pcVar6 + 0x395,"#define %s_WIDTH    %i\n",local_138,(ulong)(uint)image.width);
  iVar4 = sprintf(pcVar6 + (long)iVar3 + 0x395,"#define %s_HEIGHT   %i\n",local_138,
                  (ulong)(uint)image.height);
  iVar5 = sprintf(pcVar6 + (iVar4 + iVar3 + 0x395),
                  "#define %s_FORMAT   %i          // raylib internal pixel format\n\n",local_138,
                  (ulong)(uint)image.format);
  iVar3 = iVar5 + iVar3 + iVar4 + 0x395;
  iVar4 = sprintf(pcVar6 + iVar3,"static unsigned char %s_DATA[%i] = { ",local_138,(ulong)uVar2);
  iVar3 = iVar3 + iVar4;
  if (1 < (int)uVar2) {
    iVar4 = 0;
    uVar8 = 0;
    do {
      pcVar7 = "0x%x,\n";
      if ((int)((uVar8 & 0xffffffff) / 0x14) * 0x14 + iVar4 != 0) {
        pcVar7 = "0x%x, ";
      }
      iVar5 = sprintf(pcVar6 + iVar3,pcVar7,(ulong)*(byte *)((long)image.data + uVar8));
      iVar3 = iVar3 + iVar5;
      uVar8 = uVar8 + 1;
      iVar4 = iVar4 + -1;
    } while (uVar2 - 1 != uVar8);
  }
  sprintf(pcVar6 + iVar3,"0x%x };\n",(ulong)*(byte *)((long)image.data + (long)(int)(uVar2 - 1)));
  _Var1 = SaveFileText(fileName,pcVar6);
  free(pcVar6);
  if (_Var1) {
    pcVar6 = "FILEIO: [%s] Image as code exported successfully";
    iVar3 = 3;
  }
  else {
    pcVar6 = "FILEIO: [%s] Failed to export image as code";
    iVar3 = 4;
  }
  TraceLog(iVar3,pcVar6,fileName);
  return _Var1;
}

Assistant:

bool ExportImageAsCode(Image image, const char *fileName)
{
    bool success = false;

#if defined(SUPPORT_IMAGE_EXPORT)

#ifndef TEXT_BYTES_PER_LINE
    #define TEXT_BYTES_PER_LINE     20
#endif

    int dataSize = GetPixelDataSize(image.width, image.height, image.format);

    // NOTE: Text data buffer size is estimated considering image data size in bytes
    // and requiring 6 char bytes for every byte: "0x00, "
    char *txtData = (char *)RL_CALLOC(dataSize*6 + 2000, sizeof(char));

    int byteCount = 0;
    byteCount += sprintf(txtData + byteCount, "////////////////////////////////////////////////////////////////////////////////////////\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// ImageAsCode exporter v1.0 - Image pixel data exported as an array of bytes         //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// more info and bugs-report:  github.com/raysan5/raylib                              //\n");
    byteCount += sprintf(txtData + byteCount, "// feedback and support:       ray[at]raylib.com                                      //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// Copyright (c) 2018-2024 Ramon Santamaria (@raysan5)                                //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "////////////////////////////////////////////////////////////////////////////////////////\n\n");

    // Get file name from path and convert variable name to uppercase
    char varFileName[256] = { 0 };
    strcpy(varFileName, GetFileNameWithoutExt(fileName));
    for (int i = 0; varFileName[i] != '\0'; i++) if ((varFileName[i] >= 'a') && (varFileName[i] <= 'z')) { varFileName[i] = varFileName[i] - 32; }

    // Add image information
    byteCount += sprintf(txtData + byteCount, "// Image data information\n");
    byteCount += sprintf(txtData + byteCount, "#define %s_WIDTH    %i\n", varFileName, image.width);
    byteCount += sprintf(txtData + byteCount, "#define %s_HEIGHT   %i\n", varFileName, image.height);
    byteCount += sprintf(txtData + byteCount, "#define %s_FORMAT   %i          // raylib internal pixel format\n\n", varFileName, image.format);

    byteCount += sprintf(txtData + byteCount, "static unsigned char %s_DATA[%i] = { ", varFileName, dataSize);
    for (int i = 0; i < dataSize - 1; i++) byteCount += sprintf(txtData + byteCount, ((i%TEXT_BYTES_PER_LINE == 0)? "0x%x,\n" : "0x%x, "), ((unsigned char *)image.data)[i]);
    byteCount += sprintf(txtData + byteCount, "0x%x };\n", ((unsigned char *)image.data)[dataSize - 1]);

    // NOTE: Text data size exported is determined by '\0' (NULL) character
    success = SaveFileText(fileName, txtData);

    RL_FREE(txtData);

#endif      // SUPPORT_IMAGE_EXPORT

    if (success != 0) TRACELOG(LOG_INFO, "FILEIO: [%s] Image as code exported successfully", fileName);
    else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to export image as code", fileName);

    return success;
}